

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O2

bool __thiscall DIS::DetonationPdu::operator==(DetonationPdu *this,DetonationPdu *rhs)

{
  pointer pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  size_t idx;
  ulong uVar9;
  long lVar10;
  
  bVar2 = WarfareFamilyPdu::operator==(&this->super_WarfareFamilyPdu,&rhs->super_WarfareFamilyPdu);
  bVar3 = EntityID::operator==(&this->_munitionID,&rhs->_munitionID);
  bVar4 = EventID::operator==(&this->_eventID,&rhs->_eventID);
  bVar5 = Vector3Float::operator==(&this->_velocity,&rhs->_velocity);
  bVar6 = Vector3Double::operator==
                    (&this->_locationInWorldCoordinates,&rhs->_locationInWorldCoordinates);
  bVar7 = BurstDescriptor::operator==(&this->_burstDescriptor,&rhs->_burstDescriptor);
  bVar8 = Vector3Float::operator==
                    (&this->_locationInEntityCoordinates,&rhs->_locationInEntityCoordinates);
  bVar2 = this->_pad == rhs->_pad &&
          (this->_detonationResult == rhs->_detonationResult &&
          (bVar8 && ((bVar7 && bVar6) && ((bVar5 && bVar4) && (bVar3 && bVar2)))));
  lVar10 = 0;
  for (uVar9 = 0;
      pAVar1 = (this->_articulationParameters).
               super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar9 < (ulong)(((long)(this->_articulationParameters).
                             super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x18);
      uVar9 = uVar9 + 1) {
    bVar3 = ArticulationParameter::operator==
                      ((ArticulationParameter *)
                       ((long)&pAVar1->_vptr_ArticulationParameter + lVar10),
                       (ArticulationParameter *)
                       ((long)&((rhs->_articulationParameters).
                                super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                               _vptr_ArticulationParameter + lVar10));
    bVar2 = (bool)(bVar2 & bVar3);
    lVar10 = lVar10 + 0x18;
  }
  return bVar2;
}

Assistant:

bool DetonationPdu::operator ==(const DetonationPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = WarfareFamilyPdu::operator==(rhs);

     if( ! (_munitionID == rhs._munitionID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_velocity == rhs._velocity) ) ivarsEqual = false;
     if( ! (_locationInWorldCoordinates == rhs._locationInWorldCoordinates) ) ivarsEqual = false;
     if( ! (_burstDescriptor == rhs._burstDescriptor) ) ivarsEqual = false;
     if( ! (_locationInEntityCoordinates == rhs._locationInEntityCoordinates) ) ivarsEqual = false;
     if( ! (_detonationResult == rhs._detonationResult) ) ivarsEqual = false;
     if( ! (_pad == rhs._pad) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _articulationParameters.size(); idx++)
     {
        if( ! ( _articulationParameters[idx] == rhs._articulationParameters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }